

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::CollectSiteEdges(S2Builder *this,S2PointIndex<int> *site_index)

{
  s2textformat *this_00;
  s2textformat *this_01;
  double dVar1;
  double dVar2;
  pointer pVVar3;
  PointData *pPVar4;
  pointer pRVar5;
  int iVar6;
  pointer ppVar7;
  ostream *poVar8;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *paVar9;
  iterator pvVar10;
  long lVar11;
  S2Point *point;
  S2Point *point_00;
  compact_array_base<int,_std::allocator<int>_> *this_02;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  *__range2;
  _Head_base<0UL,_Vector3<double>,_false> *x;
  S2Builder *this_03;
  Result *result;
  pointer pRVar12;
  ulong uVar13;
  bool bVar14;
  const_iterator cVar15;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2ClosestPointQueryEdgeTarget target;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  local_488;
  S2Builder *local_470;
  undefined **local_468;
  undefined **local_460;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *local_458;
  ulong local_450;
  anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *local_448;
  string local_440;
  string local_420;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  S2ClosestPointQueryOptions local_3e8;
  Options local_3c8;
  S2ClosestPointQueryBase<S2MinDistance,_int> local_3a8;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3e8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,0.0);
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._0_5_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._5_3_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_ = 0x7fffffff;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_ = false;
  local_470 = this;
  S2ClosestPointQueryOptions::set_conservative_max_distance
            (&local_3e8,(S1ChordAngle)(this->edge_site_query_radius_ca_).length2_);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_420,0.0);
  local_3c8.max_error_.length2_._0_5_ = SUB85(local_420._M_dataplus._M_p,0);
  local_3c8.max_error_.length2_._5_3_ = (undefined3)((ulong)local_420._M_dataplus._M_p >> 0x28);
  local_3c8.region_._0_5_ = 0;
  local_3c8.region_._5_3_ = 0;
  local_3c8.max_results_ = 0x7fffffff;
  local_3c8.use_brute_force_ = false;
  S2ClosestPointQueryBase<S2MinDistance,_int>::S2ClosestPointQueryBase(&local_3a8);
  local_3c8.region_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_;
  local_3c8.region_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_;
  local_3c8.max_results_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_;
  local_3c8.use_brute_force_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_;
  local_3c8.max_distance_.super_S1ChordAngle.length2_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_distance_.
       super_S1ChordAngle.length2_;
  local_3c8.max_error_.length2_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_;
  local_3c8.max_error_.length2_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_;
  local_3a8.index_ = site_index;
  local_3a8.iter_.map_ = &site_index->map_;
  local_3a8.iter_.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)site_index);
  local_3a8.iter_.iter_.position = 0;
  cVar15 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                  *)local_3a8.iter_.map_);
  this_03 = local_470;
  local_3a8.iter_.end_.node = cVar15.node;
  local_3a8.iter_.end_.position = cVar15.position;
  if (local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_488.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458 = &local_470->edge_sites_;
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::resize(local_458,
           (long)(local_470->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_470->input_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar7 = (this_03->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this_03->input_edges_).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar7) {
    uVar13 = 0;
    local_460 = &PTR__S2DistanceTarget_002bca20;
    local_468 = &PTR__S2DistanceTarget_002bbd18;
    do {
      pVVar3 = (this_03->input_vertices_).
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = (s2textformat *)(pVVar3 + ppVar7[uVar13].first);
      this_01 = (s2textformat *)(pVVar3 + ppVar7[uVar13].second);
      if (s2builder_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"S2Polyline: ",0xc)
        ;
        s2textformat::ToString_abi_cxx11_(&local_420,this_00,point);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_420._M_dataplus._M_p,
                            local_420._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        s2textformat::ToString_abi_cxx11_(&local_440,this_01,point_00);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_440._M_dataplus._M_p,local_440._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p);
        }
      }
      local_420.field_2._8_8_ = *(undefined8 *)(this_00 + 0x10);
      local_420._M_string_length = *(size_type *)this_00;
      local_420.field_2._M_allocated_capacity = *(undefined8 *)(this_00 + 8);
      local_3f0 = *(undefined8 *)(this_01 + 0x10);
      local_400 = *(undefined8 *)this_01;
      uStack_3f8 = *(undefined8 *)(this_01 + 8);
      local_420._M_dataplus._M_p = (pointer)local_468;
      S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPoints
                (&local_3a8,(Target *)&local_420,&local_3c8,&local_488);
      this_02 = &(local_458->
                 super__Vector_base<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar13].
                 super_compact_array_base<int,_std::allocator<int>_>;
      local_450 = uVar13;
      gtl::compact_array_base<int,_std::allocator<int>_>::reallocate
                (this_02,(size_type_conflict)
                         ((ulong)((long)local_488.
                                        super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_488.
                                       super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4));
      pRVar5 = local_488.
               super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_488.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_488.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_448 = &this_02->field_7;
        pRVar12 = local_488.
                  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          paVar9 = local_448;
          if (this_02->is_inlined_ == false) {
            paVar9 = (anon_union_8_2_a5b77b59_for_compact_array_base<int,_std::allocator<int>_>_13 *
                     )(this_02->field_7).pointer_;
          }
          pPVar4 = pRVar12->point_data_;
          pvVar10 = gtl::compact_array_base<int,_std::allocator<int>_>::make_hole
                              (this_02,(const_iterator)
                                       ((long)paVar9 + (ulong)(*(uint *)this_02 & 0xffffff) * 4),1);
          this_03 = local_470;
          *pvVar10 = (pPVar4->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                     super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
          if ((local_470->snapping_needed_ == false) &&
             (dVar1 = (local_470->min_edge_site_separation_ca_limit_).length2_,
             (pRVar12->distance_).super_S1ChordAngle.length2_ <= dVar1 &&
             dVar1 != (pRVar12->distance_).super_S1ChordAngle.length2_)) {
            x = &(pRVar12->point_data_->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                 super__Head_base<0UL,_Vector3<double>,_false>;
            lVar11 = 0;
            do {
              dVar1 = *(double *)((long)(x->_M_head_impl).c_ + lVar11);
              dVar2 = *(double *)(this_00 + lVar11);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar14 = lVar11 != 0x10;
              lVar11 = lVar11 + 8;
            } while (bVar14);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              lVar11 = 0;
              do {
                dVar1 = *(double *)((long)(x->_M_head_impl).c_ + lVar11);
                dVar2 = *(double *)(this_01 + lVar11);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar14 = lVar11 != 0x10;
                lVar11 = lVar11 + 8;
              } while (bVar14);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                iVar6 = s2pred::CompareEdgeDistance
                                  (&x->_M_head_impl,(S2Point *)this_00,(S2Point *)this_01,
                                   (S1ChordAngle)(local_470->min_edge_site_separation_ca_).length2_)
                ;
                if (iVar6 < 0) {
                  this_03->snapping_needed_ = true;
                }
              }
            }
          }
          pRVar12 = pRVar12 + 1;
        } while (pRVar12 != pRVar5);
      }
      SortSitesByDistance(this_03,(S2Point *)this_00,
                          (compact_array<int,_std::allocator<int>_> *)this_02);
      uVar13 = local_450 + 1;
      ppVar7 = (this_03->input_edges_).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this_03->input_edges_).
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 3))
    ;
  }
  if (local_488.
      super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2ClosestPointQueryBase<S2MinDistance,_int>::~S2ClosestPointQueryBase(&local_3a8);
  return;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}